

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_symbol.cpp
# Opt level: O1

void __thiscall SymbolTableTree::~SymbolTableTree(SymbolTableTree *this)

{
  pointer pcVar1;
  
  pcVar1 = (this->current_table_name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->current_table_name).field_2) {
    operator_delete(pcVar1);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolTable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolTable>_>_>
  ::~vector(&this->m_table_tree);
  pcVar1 = (this->m_BOTTOM_LEVEL)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_BOTTOM_LEVEL).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

SymbolTableTree::~SymbolTableTree() {
}